

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

void __thiscall vox::DICT::Add(DICT *this,string *vKey,string *vValue)

{
  string local_b0 [32];
  string local_90 [32];
  DICTitem local_70;
  string *local_20;
  string *vValue_local;
  string *vKey_local;
  DICT *this_local;
  
  local_20 = vValue;
  vValue_local = vKey;
  vKey_local = (string *)this;
  std::__cxx11::string::string(local_90,(string *)vKey);
  std::__cxx11::string::string(local_b0,(string *)vValue);
  DICTitem::DICTitem(&local_70,(string *)local_90,(string *)local_b0);
  std::vector<vox::DICTitem,_std::allocator<vox::DICTitem>_>::push_back(&this->keys,&local_70);
  DICTitem::~DICTitem(&local_70);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

void DICT::Add(std::string vKey, std::string vValue) { keys.push_back(DICTitem(vKey, vValue)); }